

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

int mbedtls_net_recv_timeout(void *ctx,uchar *buf,size_t len,uint32_t timeout)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  timeval *__timeout;
  timeval tv;
  fd_set read_fds;
  timeval local_a8;
  fd_set local_98;
  
  uVar1 = *ctx;
  if (-1 < (int)uVar1) {
    local_98.fds_bits[0xe] = 0;
    local_98.fds_bits[0xf] = 0;
    local_98.fds_bits[0xc] = 0;
    local_98.fds_bits[0xd] = 0;
    local_98.fds_bits[10] = 0;
    local_98.fds_bits[0xb] = 0;
    local_98.fds_bits[8] = 0;
    local_98.fds_bits[9] = 0;
    local_98.fds_bits[6] = 0;
    local_98.fds_bits[7] = 0;
    local_98.fds_bits[4] = 0;
    local_98.fds_bits[5] = 0;
    local_98.fds_bits[2] = 0;
    local_98.fds_bits[3] = 0;
    local_98.fds_bits[0] = 0;
    local_98.fds_bits[1] = 0;
    local_98.fds_bits[uVar1 >> 6] = local_98.fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
    local_a8.tv_sec = (ulong)timeout / 1000;
    local_a8.tv_usec = (__suseconds_t)((timeout % 1000) * 1000);
    __timeout = &local_a8;
    if (timeout == 0) {
      __timeout = (timeval *)0x0;
    }
    iVar2 = select(uVar1 + 1,&local_98,(fd_set *)0x0,(fd_set *)0x0,__timeout);
    if (iVar2 == 0) {
      iVar2 = -0x6800;
    }
    else if (iVar2 < 0) {
      piVar3 = __errno_location();
      iVar2 = -0x4c;
      if (*piVar3 == 4) {
        iVar2 = -0x6900;
      }
    }
    else {
      iVar2 = mbedtls_net_recv(ctx,buf,len);
    }
    return iVar2;
  }
  return -0x45;
}

Assistant:

int mbedtls_net_recv_timeout( void *ctx, unsigned char *buf, size_t len,
                      uint32_t timeout )
{
    int ret;
    struct timeval tv;
    fd_set read_fds;
    int fd = ((mbedtls_net_context *) ctx)->fd;

    if( fd < 0 )
        return( MBEDTLS_ERR_NET_INVALID_CONTEXT );

    FD_ZERO( &read_fds );
    FD_SET( fd, &read_fds );

    tv.tv_sec  = timeout / 1000;
    tv.tv_usec = ( timeout % 1000 ) * 1000;

    ret = select( fd + 1, &read_fds, NULL, NULL, timeout == 0 ? NULL : &tv );

    /* Zero fds ready means we timed out */
    if( ret == 0 )
        return( MBEDTLS_ERR_SSL_TIMEOUT );

    if( ret < 0 )
    {
#if ( defined(_WIN32) || defined(_WIN32_WCE) ) && !defined(EFIX64) && \
    !defined(EFI32)
        if( WSAGetLastError() == WSAEINTR )
            return( MBEDTLS_ERR_SSL_WANT_READ );
#else
        if( errno == EINTR )
            return( MBEDTLS_ERR_SSL_WANT_READ );
#endif

        return( MBEDTLS_ERR_NET_RECV_FAILED );
    }

    /* This call will not block */
    return( mbedtls_net_recv( ctx, buf, len ) );
}